

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::Mesh::keyframe(Mesh *this,double t)

{
  double dVar1;
  Vector3D local_60;
  Vector3D local_48;
  Vector3D local_30;
  double local_18;
  double t_local;
  Mesh *this_local;
  
  local_18 = t;
  t_local = (double)this;
  Vector3D::Vector3D(&local_30,&(this->super_SceneObject).position);
  Spline<CMU462::Vector3D>::setValue(&(this->super_SceneObject).positions,t,&local_30);
  dVar1 = local_18;
  Vector3D::Vector3D(&local_48,&(this->super_SceneObject).rotation);
  Spline<CMU462::Vector3D>::setValue(&(this->super_SceneObject).rotations,dVar1,&local_48);
  dVar1 = local_18;
  Vector3D::Vector3D(&local_60,&(this->super_SceneObject).scale);
  Spline<CMU462::Vector3D>::setValue(&(this->super_SceneObject).scales,dVar1,&local_60);
  if (this->skeleton != (Skeleton *)0x0) {
    Skeleton::keyframe(this->skeleton,local_18);
  }
  return;
}

Assistant:

void Mesh::keyframe(double t) {
  positions.setValue(t, position);
  rotations.setValue(t, rotation);
  scales.setValue(t, scale);
  if (skeleton) skeleton->keyframe(t);
}